

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsPolygonItem::QGraphicsPolygonItem(QGraphicsPolygonItem *this,QGraphicsItem *parent)

{
  QGraphicsPolygonItemPrivate *this_00;
  
  this_00 = (QGraphicsPolygonItemPrivate *)operator_new(0x1c8);
  QGraphicsPolygonItemPrivate::QGraphicsPolygonItemPrivate(this_00);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
            (&this->super_QAbstractGraphicsShapeItem,(QAbstractGraphicsShapeItemPrivate *)this_00,
             parent);
  (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem._vptr_QGraphicsItem =
       (_func_int **)&PTR__QGraphicsPixmapItem_007ebc00;
  return;
}

Assistant:

QGraphicsPolygonItem::QGraphicsPolygonItem(QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsPolygonItemPrivate, parent)
{
}